

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

CAmount __thiscall wallet::CWallet::GetDebit(CWallet *this,CTransaction *tx,isminefilter *filter)

{
  pointer pCVar1;
  CAmount CVar2;
  runtime_error *this_00;
  pointer txin;
  ulong uVar3;
  long in_FS_OFFSET;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  txin = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
         ._M_start;
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = 0;
  do {
    if (txin == pCVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar3;
      }
      goto LAB_009a4037;
    }
    CVar2 = GetDebit(this,txin,filter);
    uVar3 = uVar3 + CVar2;
    txin = txin + 1;
  } while (uVar3 < 0x775f05a074001);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"GetDebit",&local_79);
  std::operator+(&local_58,&local_78,": value out of range");
  std::runtime_error::runtime_error(this_00,(string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_009a4037:
  __stack_chk_fail();
}

Assistant:

CAmount CWallet::GetDebit(const CTransaction& tx, const isminefilter& filter) const
{
    CAmount nDebit = 0;
    for (const CTxIn& txin : tx.vin)
    {
        nDebit += GetDebit(txin, filter);
        if (!MoneyRange(nDebit))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
    }
    return nDebit;
}